

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O3

void __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setup(SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this)

{
  int *piVar1;
  uint *puVar2;
  pointer pnVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_80;
  
  if (this->setupStatus == false) {
    uVar6 = (int)((long)(this->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x33333333;
    (this->super_IdxSet).num = 0;
    if (0 < (int)uVar6) {
      lVar5 = 0;
      uVar7 = 0;
      do {
        pnVar3 = (this->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
                  (&local_d8,0,(type *)0x0);
        if (((*(int *)((long)&(pnVar3->m_backend).data + lVar5 + 0x48) == 2) ||
            (local_d8.fpclass == cpp_dec_float_NaN)) ||
           (iVar4 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              ((cpp_dec_float<100U,_int,_void> *)
                               ((long)&(pnVar3->m_backend).data + lVar5),&local_d8), iVar4 != 0)) {
          pnVar3 = (this->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_d8.exp = *(int *)((long)&(pnVar3->m_backend).data + lVar5 + 0x40);
          local_d8.neg = *(bool *)((long)&(pnVar3->m_backend).data + lVar5 + 0x44);
          local_d8._72_8_ = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar5 + 0x48);
          puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar5);
          local_d8.data._M_elems._0_8_ = *(undefined8 *)puVar2;
          local_d8.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
          puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar5 + 0x10);
          local_d8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          local_d8.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
          puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar5 + 0x20);
          local_d8.data._M_elems._32_8_ = *(undefined8 *)puVar2;
          local_d8.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
          puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar5 + 0x30);
          local_d8.data._M_elems._48_8_ = *(undefined8 *)puVar2;
          local_d8.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
          if ((local_d8.neg == true) &&
             (local_d8.fpclass != cpp_dec_float_finite || local_d8.data._M_elems[0] != 0)) {
            local_d8.neg = false;
          }
          getEpsilon((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_80,this);
          if (((local_d8.fpclass == cpp_dec_float_NaN) || (local_80.fpclass == cpp_dec_float_NaN))
             || (iVar4 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                   (&local_d8,&local_80), 0 < iVar4)) {
            (this->super_IdxSet).idx[(this->super_IdxSet).num] = (int)uVar7;
            piVar1 = &(this->super_IdxSet).num;
            *piVar1 = *piVar1 + 1;
          }
          else {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
            cpp_dec_float<long_long>(&local_d8,0,(type *)0x0);
            pnVar3 = (this->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar5 + 0x30);
            *(undefined8 *)puVar2 = local_d8.data._M_elems._48_8_;
            *(undefined8 *)(puVar2 + 2) = local_d8.data._M_elems._56_8_;
            puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar5 + 0x20);
            *(undefined8 *)puVar2 = local_d8.data._M_elems._32_8_;
            *(undefined8 *)(puVar2 + 2) = local_d8.data._M_elems._40_8_;
            puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar5 + 0x10);
            *(undefined8 *)puVar2 = local_d8.data._M_elems._16_8_;
            *(undefined8 *)(puVar2 + 2) = local_d8.data._M_elems._24_8_;
            puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar5);
            *(undefined8 *)puVar2 = local_d8.data._M_elems._0_8_;
            *(undefined8 *)(puVar2 + 2) = local_d8.data._M_elems._8_8_;
            *(int *)((long)&(pnVar3->m_backend).data + lVar5 + 0x40) = local_d8.exp;
            *(bool *)((long)&(pnVar3->m_backend).data + lVar5 + 0x44) = local_d8.neg;
            *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar5 + 0x48) = local_d8._72_8_;
          }
        }
        uVar7 = uVar7 + 1;
        lVar5 = lVar5 + 0x50;
      } while ((uVar6 & 0x7fffffff) != uVar7);
    }
    this->setupStatus = true;
  }
  return;
}

Assistant:

void setup()
   {
      if(!isSetup())
      {
         IdxSet::clear();

         int d = dim();
         num = 0;

         for(int i = 0; i < d; ++i)
         {
            if(VectorBase<R>::val[i] != R(0))
            {
               if(spxAbs(VectorBase<R>::val[i]) <= this->getEpsilon())
                  VectorBase<R>::val[i] = R(0);
               else
               {
                  idx[num] = i;
                  num++;
               }
            }
         }

         setupStatus = true;

         assert(isConsistent());
      }
   }